

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

void __thiscall cmSearchPath::AddPath(cmSearchPath *this,string *path)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  AddPathInternal(this,path,&local_38,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmSearchPath::AddPath(const std::string& path)
{
  this->AddPathInternal(path, "");
}